

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void drop_kv_on_snap_iterator_test(void)

{
  fdb_status fVar1;
  char *__format;
  fdb_kvs_handle *snap_kv;
  fdb_kvs_handle *kv;
  fdb_file_handle *f1;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_kvs_handle *kv2;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_kvs_handle *local_168;
  fdb_kvs_handle *local_160;
  fdb_file_handle *local_158;
  fdb_iterator *local_150;
  fdb_doc *local_148;
  fdb_kvs_handle *local_140;
  timeval local_138;
  fdb_kvs_config local_128;
  fdb_config local_110;
  
  gettimeofday(&local_138,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_148 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&local_158,"./mvcc_test1",&local_110);
  fdb_kvs_open_default(local_158,&local_140,&local_128);
  fdb_kvs_open(local_158,&local_160,"kv",&local_128);
  fVar1 = fdb_set_kv(local_160,"a",1,(void *)0x0,0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_set_kv(local_160,"b",1,(void *)0x0,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d304;
    fdb_commit(local_158,'\x01');
    fVar1 = fdb_snapshot_open(local_160,&local_168,2);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d30b;
    fVar1 = fdb_iterator_init(local_168,&local_150,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d310;
    fVar1 = fdb_kvs_close(local_168);
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_0011d315;
    fVar1 = fdb_kvs_close(local_160);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d31a;
    fVar1 = fdb_kvs_remove(local_158,"kv");
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_0011d31f;
    fVar1 = fdb_iterator_get(local_150,&local_148);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d324;
    fdb_doc_free(local_148);
    fVar1 = fdb_iterator_close(local_150);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d329;
    fVar1 = fdb_kvs_close(local_168);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d32e;
    fVar1 = fdb_kvs_close(local_140);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_close(local_158);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        __format = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        fprintf(_stderr,__format,"drop kv other handle test");
        return;
      }
      goto LAB_0011d338;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d304:
    drop_kv_on_snap_iterator_test();
LAB_0011d30b:
    drop_kv_on_snap_iterator_test();
LAB_0011d310:
    drop_kv_on_snap_iterator_test();
LAB_0011d315:
    drop_kv_on_snap_iterator_test();
LAB_0011d31a:
    drop_kv_on_snap_iterator_test();
LAB_0011d31f:
    drop_kv_on_snap_iterator_test();
LAB_0011d324:
    drop_kv_on_snap_iterator_test();
LAB_0011d329:
    drop_kv_on_snap_iterator_test();
LAB_0011d32e:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d338:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return;
}

Assistant:

void drop_kv_on_snap_iterator_test(){

    TEST_INIT();
    memleak_start();

    int r;

    fdb_status status;
    fdb_file_handle *f1;
    fdb_kvs_handle *kv, *kv2, *snap_kv;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_doc *rdoc = NULL;
    fdb_iterator *iterator;

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_open(&f1, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(f1, &kv2, &kvs_config);
    fdb_kvs_open(f1, &kv, "kv", &kvs_config);

    // write 2 seqno's
    status = fdb_set_kv(kv, (void *) "a", 1, NULL, 0);
    TEST_STATUS(status);
    status = fdb_set_kv(kv, (void *) "b", 1, NULL, 0);
    TEST_STATUS(status);
    fdb_commit(f1, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // open snapshot
    status = fdb_snapshot_open(kv, &snap_kv, 2);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // open iterator on snapshot
    status = fdb_iterator_init(snap_kv, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_kvs_close(snap_kv);
    TEST_CHK(status != FDB_RESULT_SUCCESS);

    // close kvs
    status = fdb_kvs_close(kv);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // drop kvs
    status = fdb_kvs_remove(f1, "kv");
    TEST_CHK(status != FDB_RESULT_SUCCESS);

    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_close(snap_kv);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_close(kv2);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_close(f1);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_shutdown();

    memleak_end();
    TEST_RESULT("drop kv other handle test");
}